

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t44(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  uVar3 = al_ustr_new(anon_var_dwarf_11c3);
  uVar4 = al_ustr_new(anon_var_dwarf_11cf);
  cVar1 = al_ustr_replace_range(uVar3,2,10,uVar4);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_replace_range(us1, 2, 10, us2)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_replace_range(us1, 2, 10, us2)");
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_11e7);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_11f3);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_11f3);
    error = error + 1;
  }
  cVar1 = al_ustr_replace_range(uVar3,5,0xb,uVar3);
  if (cVar1 == '\0') {
    log_printf("FAIL %s\n","al_ustr_replace_range(us1, 5, 11, us1)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","al_ustr_replace_range(us1, 5, 11, us1)");
  }
  pcVar5 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_120b);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_1217);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_1217);
    error = error + 1;
  }
  al_ustr_free(uVar3);
  al_ustr_free(uVar4);
  return;
}

Assistant:

static void t44(void)
{
   ALLEGRO_USTR *us1 = al_ustr_new("Šis kungs par visu samaksās");
   ALLEGRO_USTR *us2 = al_ustr_new("ī kundze");

   CHECK(al_ustr_replace_range(us1, 2, 10, us2));
   CHECK(0 == strcmp(al_cstr(us1), "Šī kundze par visu samaksās"));

   /* Insert into itself. */
   CHECK(al_ustr_replace_range(us1, 5, 11, us1));
   CHECK(0 == strcmp(al_cstr(us1),
         "Šī Šī kundze par visu samaksās par visu samaksās"));

   al_ustr_free(us1);
   al_ustr_free(us2);
}